

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leg_track.cpp
# Opt level: O3

void __thiscall
cp::LegTrack::init_setup
          (LegTrack *this,double sampling_time,double single_sup_time,double double_sup_time,
          double legh,Affine3d *now_leg_pose,Quat *waist_r)

{
  Affine3d *aff;
  undefined1 auVar1 [16];
  double dVar2;
  SrcEvaluatorType srcEvaluator;
  
  Pose::set((Pose *)(this + 0x450),now_leg_pose);
  aff = now_leg_pose + 1;
  Pose::set((Pose *)(this + 0x530),aff);
  Pose::set((Pose *)(this + 0x610),now_leg_pose);
  Pose::set((Pose *)(this + 0x6f0),aff);
  Pose::set((Pose *)(this + 0x260),now_leg_pose);
  Pose::set((Pose *)(this + 0x340),aff);
  *(double *)(this + 0x1d8) = *(double *)(this + 0x460);
  dVar2 = (waist_r->m_coeffs).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
          .m_data.array[1];
  *(double *)(this + 0x200) =
       (waist_r->m_coeffs).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[0];
  *(double *)(this + 0x208) = dVar2;
  dVar2 = (waist_r->m_coeffs).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
          .m_data.array[3];
  *(double *)(this + 0x210) =
       (waist_r->m_coeffs).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[2];
  *(double *)(this + 0x218) = dVar2;
  dVar2 = (waist_r->m_coeffs).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
          .m_data.array[1];
  *(double *)(this + 0x220) =
       (waist_r->m_coeffs).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[0];
  *(double *)(this + 0x228) = dVar2;
  dVar2 = (waist_r->m_coeffs).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
          .m_data.array[3];
  *(double *)(this + 0x230) =
       (waist_r->m_coeffs).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[2];
  *(double *)(this + 0x238) = dVar2;
  *(double *)(this + 0x1b0) = sampling_time;
  *(double *)(this + 0x1b8) = single_sup_time;
  *(double *)(this + 0x1c0) = double_sup_time;
  dVar2 = legh + *(double *)(this + 0x460);
  auVar1._8_4_ = SUB84(dVar2,0);
  auVar1._0_8_ = double_sup_time + single_sup_time;
  auVar1._12_4_ = (int)((ulong)dVar2 >> 0x20);
  *(undefined1 (*) [16])(this + 0x1c8) = auVar1;
  return;
}

Assistant:

void LegTrack::init_setup(double sampling_time, double single_sup_time,
                          double double_sup_time, double legh,
                          const Affine3d now_leg_pose[2], const Quat& waist_r) {
  init_pose[right].set(now_leg_pose[right]);
  init_pose[left].set(now_leg_pose[left]);
  bfr_landpose[right].set(now_leg_pose[right]);
  bfr_landpose[left].set(now_leg_pose[left]);
  ref_landpose[right].set(now_leg_pose[right]);
  ref_landpose[left].set(now_leg_pose[left]);

  ground_h = init_pose[0].p().z();
  waist = waist_r;  ref_waist_r = waist_r;
  setup(sampling_time, single_sup_time, double_sup_time, legh);
}